

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb<char,_false,_6>_> __thiscall
immutable::rrb_details::push_down_tail<char,false,6>
          (rrb_details *this,ref<immutable::rrb<char,_false,_6>_> *in,
          ref<immutable::rrb<char,_false,_6>_> *new_rrb,
          ref<immutable::rrb_details::leaf_node<char,_false>_> *new_tail)

{
  rrb_size_table<false> *prVar1;
  rrb<char,_false,_6> *prVar2;
  tree_node<char,_false> *ptVar3;
  long lVar4;
  byte bVar5;
  ref<immutable::rrb<char,_false,_6>_> *prVar6;
  ref<immutable::rrb_details::internal_node<char,_false>_> *to_set;
  ref<immutable::rrb_details::internal_node<char,false>> *prVar7;
  internal_node<char,_false> *piVar8;
  rrb<char,_false,_6> *prVar9;
  uint uVar10;
  char *__function;
  uint uVar11;
  uint32_t uVar12;
  uint32_t k;
  uint uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  ref<immutable::rrb_details::rrb_size_table<false>_> table;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old_tail;
  ref<immutable::rrb_details::internal_node<char,_false>_> current;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_58;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_50;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_48;
  rrb<char,_false,_6> *local_40;
  ref<immutable::rrb<char,_false,_6>_> *local_38;
  
  prVar9 = new_rrb->ptr;
  if (prVar9 != (rrb<char,_false,_6> *)0x0) {
    local_50.ptr = (prVar9->tail).ptr;
    if (local_50.ptr != (leaf_node<char,_false> *)0x0) {
      (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
    }
    ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&prVar9->tail,new_tail);
    prVar9 = in->ptr;
    if (prVar9 != (rrb<char,_false,_6> *)0x0) {
      piVar8 = (internal_node<char,_false> *)(prVar9->root).ptr;
      if (piVar8 == (internal_node<char,_false> *)0x0) {
        prVar9 = new_rrb->ptr;
        if (prVar9 != (rrb<char,_false,_6> *)0x0) {
          prVar9->shift = 0;
          if (local_50.ptr != (leaf_node<char,_false> *)0x0) {
            (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
          }
          local_58.ptr = (internal_node<char,_false> *)(prVar9->root).ptr;
          (prVar9->root).ptr = (tree_node<char,_false> *)local_50.ptr;
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_58);
          prVar9 = new_rrb->ptr;
          *(rrb<char,_false,_6> **)this = prVar9;
          if (prVar9 != (rrb<char,_false,_6> *)0x0) {
            prVar9->_ref_count = prVar9->_ref_count + 1;
          }
          goto LAB_0014b89a;
        }
      }
      else {
        uVar16 = prVar9->cnt;
        piVar8->_ref_count = piVar8->_ref_count + 1;
        uVar14 = prVar9->shift;
        uVar12 = 0;
        local_48.ptr = piVar8;
        local_40 = (rrb<char,_false,_6> *)this;
        local_38 = in;
        if (uVar14 < 7) {
          uVar16 = 0;
        }
        else {
          uVar13 = uVar16 - 1;
          uVar12 = 0;
          uVar15 = 0;
          do {
            prVar1 = ((local_48.ptr)->size_table).ptr;
            if (prVar1 == (rrb_size_table<false> *)0x0) {
              bVar5 = (byte)uVar14;
              k = uVar12;
              if (uVar13 >> (bVar5 + 6 & 0x1f) == 0) {
                uVar11 = uVar13 >> (bVar5 & 0x1f) & 0x3f;
                uVar13 = uVar13 & ~(0x3f << (bVar5 & 0x1f));
                uVar10 = (local_48.ptr)->len;
                goto LAB_0014b615;
              }
LAB_0014b6e3:
              uVar16 = uVar15 + (uVar14 - 7) / 6 + 2;
              goto LAB_0014b6fa;
            }
            uVar10 = (local_48.ptr)->len;
            uVar11 = uVar10 - 1;
            if (uVar11 == 0) {
              uVar11 = 0;
              uVar10 = 1;
              uVar12 = uVar15 + 1;
            }
            else {
              uVar13 = uVar13 - prVar1->size[uVar10 - 2];
LAB_0014b615:
              if (uVar11 < 0x3f) {
                uVar12 = uVar15 + 1;
              }
            }
            uVar16 = uVar15 + 1;
            if (uVar11 < uVar10) {
              ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                        (&local_48,(local_48.ptr)->child + uVar11);
            }
            else {
              local_58.ptr = (internal_node<char,_false> *)0x0;
              ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                        (&local_48,&local_58);
              release<char>(local_58.ptr);
            }
            k = uVar16;
            if (local_48.ptr == (internal_node<char,_false> *)0x0) goto LAB_0014b6e3;
            uVar14 = uVar14 - 6;
            uVar15 = uVar16;
          } while (6 < uVar14);
        }
        k = uVar12;
        if ((uVar14 != 0) && (uVar16 = uVar16 + 1, (local_48.ptr)->len < 0x40)) {
          k = uVar16;
        }
LAB_0014b6fa:
        if (k != 0) {
          if (local_50.ptr == (leaf_node<char,_false> *)0x0) {
LAB_0014b8e8:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
            ;
            goto LAB_0014b8de;
          }
          to_set = copy_first_k<char,false,6>(local_38,new_rrb,k,(local_50.ptr)->len);
          prVar7 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                   append_empty<char,false>(to_set,uVar16 - k);
          this = (rrb_details *)local_40;
          ref<immutable::rrb_details::internal_node<char,false>>::operator=(prVar7,&local_50);
LAB_0014b882:
          prVar9 = new_rrb->ptr;
          *(rrb<char,_false,_6> **)this = prVar9;
          if (prVar9 != (rrb<char,_false,_6> *)0x0) {
            prVar9->_ref_count = prVar9->_ref_count + 1;
          }
          release<char>(local_48.ptr);
LAB_0014b89a:
          if ((local_50.ptr != (leaf_node<char,_false> *)0x0) &&
             (uVar16 = (local_50.ptr)->_ref_count, (local_50.ptr)->_ref_count = uVar16 - 1,
             uVar16 == 1)) {
            free(local_50.ptr);
          }
          return (ref<immutable::rrb<char,_false,_6>_>)(rrb<char,_false,_6> *)this;
        }
        piVar8 = (internal_node<char,_false> *)malloc(0x30);
        prVar6 = local_38;
        (piVar8->size_table).ptr = (rrb_size_table<false> *)0x0;
        piVar8->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(piVar8 + 1);
        piVar8[1].type = LEAF_NODE;
        piVar8[1].len = 0;
        piVar8[1]._ref_count = 0;
        piVar8[1].guid = 0;
        piVar8->type = INTERNAL_NODE;
        piVar8->len = 2;
        piVar8->_ref_count = 1;
        piVar8->guid = 0;
        if (local_38->ptr != (rrb<char,_false,_6> *)0x0) {
          ref<immutable::rrb_details::internal_node<char,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<char,false>> *)(piVar8 + 1),
                     &local_38->ptr->root);
          prVar9 = new_rrb->ptr;
          if (prVar9 != (rrb<char,_false,_6> *)0x0) {
            piVar8->_ref_count = piVar8->_ref_count + 1;
            local_58.ptr = (internal_node<char,_false> *)(prVar9->root).ptr;
            (prVar9->root).ptr = (tree_node<char,_false> *)piVar8;
            ref<immutable::rrb_details::tree_node<char,_false>_>::~ref
                      ((ref<immutable::rrb_details::tree_node<char,_false>_> *)&local_58);
            prVar9 = new_rrb->ptr;
            if (prVar9 != (rrb<char,_false,_6> *)0x0) {
              prVar9->shift = prVar9->shift + 6;
              prVar2 = prVar6->ptr;
              if (prVar2 != (rrb<char,_false,_6> *)0x0) {
                ptVar3 = (prVar2->root).ptr;
                if (ptVar3 == (tree_node<char,_false> *)0x0) {
                  __function = 
                  "T *immutable::ref<immutable::rrb_details::tree_node<char, false>>::operator->() const [T = immutable::rrb_details::tree_node<char, false>]"
                  ;
                  goto LAB_0014b8de;
                }
                if ((ptVar3->type != LEAF_NODE) &&
                   (lVar4._0_4_ = ptVar3[1].type, lVar4._4_4_ = ptVar3[1].len, lVar4 != 0)) {
                  local_58.ptr = (internal_node<char,_false> *)malloc(0x18);
                  *(ref<immutable::rrb_details::rrb_size_table<false>_> **)local_58.ptr =
                       &(local_58.ptr)->size_table;
                  (local_58.ptr)->guid = 0;
                  (local_58.ptr)->_ref_count = 1;
                  if (local_50.ptr == (leaf_node<char,_false> *)0x0) goto LAB_0014b8e8;
                  *(uint32_t *)&((local_58.ptr)->size_table).ptr = prVar2->cnt - (local_50.ptr)->len
                  ;
                  *(uint32_t *)((long)&((local_58.ptr)->size_table).ptr + 4) = prVar2->cnt;
                  ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                            (&piVar8->size_table,
                             (ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_58);
                  if ((local_58.ptr != (internal_node<char,_false> *)0x0) &&
                     (uVar12 = (local_58.ptr)->_ref_count, (local_58.ptr)->_ref_count = uVar12 - 1,
                     uVar12 == 1)) {
                    free(local_58.ptr);
                  }
                  prVar9 = new_rrb->ptr;
                  if (prVar9 == (rrb<char,_false,_6> *)0x0) goto LAB_0014b8c9;
                }
                prVar7 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                         append_empty<char,false>
                                   ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                                    (*(long *)&(prVar9->root).ptr[1]._ref_count + 8),uVar16);
                ref<immutable::rrb_details::internal_node<char,false>>::operator=(prVar7,&local_50);
                release<char>(piVar8);
                this = (rrb_details *)local_40;
                goto LAB_0014b882;
              }
            }
          }
        }
      }
    }
  }
LAB_0014b8c9:
  __function = 
  "T *immutable::ref<immutable::rrb<char, false, 6>>::operator->() const [T = immutable::rrb<char, false, 6>]"
  ;
LAB_0014b8de:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> push_down_tail(const ref<rrb<T, atomic_ref_counting, N>>& in, const ref<rrb<T, atomic_ref_counting, N>>& new_rrb, const ref<leaf_node<T, atomic_ref_counting>>& new_tail)
      {
      ref<leaf_node<T, atomic_ref_counting>> old_tail = new_rrb->tail;
      new_rrb->tail = new_tail;
      //if (in->cnt <= bits<N>::rrb_branching)
      if (in->root.ptr == nullptr) // [JanM] old code is commented out above. Fixed this due to bug, see unit test test_bug_concat in vector_tests.cpp
        {
        new_rrb->shift = 0;
        new_rrb->root = old_tail;
        return new_rrb;
        }

      // Copyable count starts here

      // TODO: Can find last rightmost jump in constant time for pvec subvecs:
      // use the fact that (index & large_mask) == 1 << (RRB_BITS * H) - 1 -> 0 etc.

      uint32_t index = in->cnt - 1;

      uint32_t nodes_to_copy = 0;
      uint32_t nodes_visited = 0;
      uint32_t pos = 0; // pos is the position we insert empty nodes in the bottom
                        // copyable node (or the element, if we can copy the leaf)
      ref<internal_node<T, atomic_ref_counting>> current = in->root;
      uint32_t shift = in->shift;

      // checking all non-leaf nodes (or if tail, all but the lowest two levels)
      while (shift > bits<N>::rrb_bits)
        {
        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          // some check here to ensure we're not overflowing the pvec subvec.
          // important to realise that this only needs to be done once in a better
          // impl, the same way the size_table check only has to be done until it's
          // false.
          const uint32_t prev_shift = shift + bits<N>::rrb_bits;
          if (index >> prev_shift > 0)
            {
            nodes_visited++; // this could possibly be done earlier in the code.
            goto copyable_count_end;
            }
          child_index = (index >> shift) & bits<N>::rrb_mask;
          // index filtering is not necessary when the check above is performed at
          // most once.
          index &= ~(bits<N>::rrb_mask << shift);
          }
        else
          {
          // no need for sized_pos here, luckily.
          child_index = current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        nodes_visited++;
        if (child_index < bits<N>::rrb_mask)
          {
          nodes_to_copy = nodes_visited;
          pos = child_index;
          }

        if (child_index < current->len)
          current = current->child[child_index];
        else
          current = ref<internal_node<T, atomic_ref_counting>>();
        // This will only happen in a pvec subtree
        if (current.ptr == nullptr)
          {
          nodes_to_copy = nodes_visited;
          pos = child_index;

          // if next element we're looking at is null, we can copy all above. Good
          // times.
          goto copyable_count_end;
          }
        shift -= bits<N>::rrb_bits;
        }
      // if we're here, we're at the leaf node (or lowest non-leaf), which is
      // `current`

      // no need to even use index here: We know it'll be placed at current->len,
      // if there's enough space. That check is easy.
      if (shift != 0)
        {
        nodes_visited++;
        if (current->len < bits<N>::rrb_branching)
          {
          nodes_to_copy = nodes_visited;
          pos = current->len;
          }
        }

    copyable_count_end:
      // GURRHH, nodes_visited is not yet handled nicely. for loop down to get
      // nodes_visited set straight.
      while (shift > bits<N>::rrb_bits)
        {
        nodes_visited++;
        shift -= bits<N>::rrb_bits;
        }

      // Increasing height of tree.
      if (nodes_to_copy == 0)
        {
        ref<internal_node<T, atomic_ref_counting>> new_root = internal_node_create<T, atomic_ref_counting>(2);
        new_root->child[0] = in->root;
        new_rrb->root = new_root;
        new_rrb->shift = new_rrb->shift + bits<N>::rrb_bits;

        // create size table if the original rrb root has a size table.
        if (in->root->type != LEAF_NODE && ((const internal_node<T, atomic_ref_counting> *)in->root.ptr)->size_table.ptr != nullptr)
          {
          ref<rrb_size_table<atomic_ref_counting>> table = size_table_create<atomic_ref_counting>(2);
          table->size[0] = in->cnt - old_tail->len;
          // If we insert the tail, the old size minus the old tail size will be the
          // amount of elements in the left branch. If there is no tail, the size is
          // just the old rrb-tree.

          table->size[1] = in->cnt;
          // If we insert the tail, the old size would include the tail.
          // Consequently, it has to be the old size. If we have no tail, we append
          // a single element to the old vector, therefore it has to be one more
          // than the original.

          new_root->size_table = table;
          }

        // nodes visited == original rrb tree height. Nodes visited > 0.
        ref<internal_node<T, atomic_ref_counting>>* to_set = append_empty(&((internal_node<T, atomic_ref_counting> *)new_rrb->root.ptr)->child[1], nodes_visited);
        *to_set = old_tail;
        }
      else
        {
        ref<internal_node<T, atomic_ref_counting>>* node = copy_first_k(in, new_rrb, nodes_to_copy, old_tail->len);
        ref<internal_node<T, atomic_ref_counting>>* to_set = append_empty(node, nodes_visited - nodes_to_copy);
        *to_set = old_tail;
        }
      return new_rrb;
      }